

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O1

void __thiscall Tle::ExtractDouble(Tle *this,string *str,int point_pos,double *val)

{
  bool bVar1;
  char *pcVar2;
  runtime_error *prVar3;
  char *pcVar4;
  char cVar5;
  undefined1 local_60 [8];
  string temp;
  
  local_60 = (undefined1  [8])&temp._M_string_length;
  temp._M_dataplus._M_p = (pointer)0x0;
  temp._M_string_length._0_1_ = 0;
  temp.field_2._8_8_ = val;
  if (str->_M_string_length != 0) {
    pcVar2 = (str->_M_dataplus)._M_p;
    bVar1 = false;
    pcVar4 = pcVar2;
    do {
      cVar5 = (char)local_60;
      if (point_pos < 0) {
LAB_0011457c:
        if (pcVar4 == pcVar2 && point_pos == -1) {
          std::__cxx11::string::push_back(cVar5);
          std::__cxx11::string::push_back(cVar5);
        }
        if (9 < (int)*pcVar4 - 0x30U) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Invalid digit");
LAB_00114698:
          *(undefined ***)prVar3 = &PTR__runtime_error_0011acf0;
          __cxa_throw(prVar3,&TleException::typeinfo,std::runtime_error::~runtime_error);
        }
LAB_001145b8:
        std::__cxx11::string::push_back(cVar5);
      }
      else {
        if (pcVar2 + ((ulong)(uint)point_pos - 1) <= pcVar4) {
          if (pcVar4 != pcVar2 + ((ulong)(uint)point_pos - 1) || point_pos < 0) goto LAB_0011457c;
          if (temp._M_dataplus._M_p == (pointer)0x0) {
            std::__cxx11::string::push_back(cVar5);
          }
          if (*pcVar4 != '.') {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar3,"Failed to find decimal point");
            goto LAB_00114698;
          }
          goto LAB_001145b8;
        }
        if ((pcVar4 == pcVar2) && ((*pcVar4 == '-' || (*pcVar4 == '+')))) {
          std::__cxx11::string::push_back(cVar5);
        }
        else if ((int)*pcVar4 - 0x30U < 10) {
          bVar1 = true;
          std::__cxx11::string::push_back(cVar5);
        }
        else {
          if (bVar1) {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar3,"Unexpected non digit");
LAB_001146d4:
            *(undefined ***)prVar3 = &PTR__runtime_error_0011acf0;
            __cxa_throw(prVar3,&TleException::typeinfo,std::runtime_error::~runtime_error);
          }
          if (*pcVar4 != ' ') {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar3,"Invalid character");
            goto LAB_001146d4;
          }
        }
      }
      pcVar4 = pcVar4 + 1;
      pcVar2 = (str->_M_dataplus)._M_p;
    } while (pcVar4 != pcVar2 + str->_M_string_length);
  }
  bVar1 = Util::FromString<double>((string *)local_60,(double *)temp.field_2._8_8_);
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Failed to convert value to double");
    *(undefined ***)prVar3 = &PTR__runtime_error_0011acf0;
    __cxa_throw(prVar3,&TleException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_60 != (undefined1  [8])&temp._M_string_length) {
    operator_delete((void *)local_60);
  }
  return;
}

Assistant:

void Tle::ExtractDouble(const std::string& str, int point_pos, double& val)
{
    std::string temp;
    bool found_digit = false;

    for (std::string::const_iterator i = str.begin(); i != str.end(); ++i)
    {
        /*
         * integer part
         */
        if (point_pos >= 0 && i < str.begin() + point_pos - 1)
        {
            bool done = false;

            if (i == str.begin())
            {
                if(*i == '-' || *i == '+')
                {
                    /*
                     * first character could be signed
                     */
                    temp += *i;
                    done = true;
                }
            }

            if (!done)
            {
                if (isdigit(*i))
                {
                    found_digit = true;
                    temp += *i;
                }
                else if (found_digit)
                {
                    throw TleException("Unexpected non digit");
                }
                else if (*i != ' ')
                {
                    throw TleException("Invalid character");
                }
            }
        }
        /*
         * decimal point
         */
        else if (point_pos >= 0 && i == str.begin() + point_pos - 1)
        {
            if (temp.length() == 0)
            {
                /*
                 * integer part is blank, so add a '0'
                 */
                temp += '0';
            }

            if (*i == '.')
            {
                /*
                 * decimal point found
                 */
                temp += *i;
            }
            else
            {
                throw TleException("Failed to find decimal point");
            }
        }
        /*
         * fraction part
         */
        else
        {
            if (i == str.begin() && point_pos == -1)
            {
                /*
                 * no decimal point expected, add 0. beginning
                 */
                temp += '0';
                temp += '.';
            }
            
            /*
             * should be a digit
             */
            if (isdigit(*i))
            {
                temp += *i;
            }
            else
            {
                throw TleException("Invalid digit");
            }
        }
    }

    if (!Util::FromString<double>(temp, val))
    {
        throw TleException("Failed to convert value to double");
    }
}